

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_14::JUnitReporter::subcase_start(JUnitReporter *this,SubcaseSignature *in)

{
  std::mutex::lock(&this->mutex);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::push_back
            (&this->deepestSubcaseStackNames,&in->m_name);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void subcase_start(const SubcaseSignature& in) override {
            std::lock_guard<std::mutex> lock(mutex);
            deepestSubcaseStackNames.push_back(in.m_name);
        }